

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O0

void TPZShapeHDiv<pzshape::TPZShapeLinear>::ComputeVecandShape(TPZShapeData *data)

{
  int iVar1;
  int64_t iVar2;
  int *piVar3;
  long lVar4;
  long *plVar5;
  pair<int,_long> *ppVar6;
  ostream *poVar7;
  void *this;
  long in_RDI;
  int ivs;
  int maxd_1;
  int maxd;
  int d_1;
  int include_1;
  int shord [3];
  int maxorder [3];
  int sidedimension_1;
  int ish_1;
  int lastshape_1;
  int firstshape_1;
  MElementType tipo;
  int dir;
  int bil;
  int side_2;
  int ivec_1;
  int locvec_1;
  int d;
  int include;
  int sidedimension;
  int ish;
  int lastshape;
  int firstshape;
  int order;
  int connectindex;
  int face;
  int side_1;
  int ivec;
  int locvec;
  int firstface;
  int64_t nvec;
  TPZManVector<long,_27> FirstIndex;
  int scalarorder;
  TPZGenMatrix<int> shapeorders;
  int i;
  int counthold;
  TPZManVector<int,_27> permgather;
  int nlowdim;
  TPZStack<int,_10> smallsides;
  int side;
  int count;
  TPZManVector<int,_81> vecpermute;
  TPZManVector<int,_10> facevector;
  int nexternalvectors;
  int nshape;
  int pressureorder;
  TPZManVector<int,_3> normalsides;
  TPZManVector<int,_3> directions;
  TPZManVector<int,_3> bilinear;
  TPZManVector<int,_3> VectorSides;
  int64_t numvec;
  int *in_stack_fffffffffffff928;
  TPZManVector<int,_81> *in_stack_fffffffffffff930;
  TPZVec<int> *in_stack_fffffffffffff938;
  TPZVec<long> *in_stack_fffffffffffff940;
  TPZVec<int> *in_stack_fffffffffffff948;
  TPZManVector<int,_81> *in_stack_fffffffffffff950;
  int64_t in_stack_fffffffffffff958;
  TPZManVector<int,_10> *in_stack_fffffffffffff960;
  TPZVec<int> *in_stack_fffffffffffff9c0;
  TPZShapeData *in_stack_fffffffffffff9c8;
  undefined8 in_stack_fffffffffffff9d0;
  pair<int,_int> local_54c;
  int local_544;
  int local_540;
  int local_53c;
  int local_538;
  int local_534 [4];
  int local_524;
  int local_520;
  int local_51c;
  int local_518;
  int local_514;
  int local_510;
  MElementType local_50c;
  int local_508;
  int local_504;
  int local_500;
  int local_4fc;
  int local_4f8;
  pair<int,_int> local_4f4;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  int local_4d0;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  undefined4 local_4bc;
  int64_t local_4b8;
  TPZVec<long> local_4b0 [7];
  int local_3b4;
  int local_398;
  int local_394;
  TPZVec<int> local_390 [4];
  int local_2fc;
  TPZVec<int> local_2f8 [2];
  size_t in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  int iVar8;
  undefined4 in_stack_fffffffffffffd54;
  int iVar9;
  TPZVec<int> local_2a8 [11];
  undefined4 local_13c;
  TPZVec<int> local_138 [2];
  int local_ec;
  int local_e8;
  int local_e4;
  TPZVec<int> local_b0 [2];
  TPZVec<int> local_70;
  TPZVec<int> local_40;
  undefined8 local_10;
  long local_8;
  
  local_10 = 3;
  local_8 = in_RDI;
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)in_stack_fffffffffffff950,(int64_t)in_stack_fffffffffffff948);
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)in_stack_fffffffffffff950,(int64_t)in_stack_fffffffffffff948);
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)in_stack_fffffffffffff950,(int64_t)in_stack_fffffffffffff948);
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)in_stack_fffffffffffff950,(int64_t)in_stack_fffffffffffff948);
  pztopology::TPZLine::GetSideHDivDirections
            (&in_stack_fffffffffffff950->super_TPZVec<int>,in_stack_fffffffffffff948,
             (TPZVec<int> *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  iVar2 = TPZVec<std::pair<int,_long>_>::size((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510));
  if (iVar2 == 0) {
    pzinternal::DebugStopImpl
              ((char *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               in_stack_fffffffffffffd48);
  }
  piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(local_8 + 0x2b50),2);
  local_e4 = *piVar3;
  local_e8 = pzshape::TPZShapeLinear::NShapeF(&in_stack_fffffffffffff930->super_TPZVec<int>);
  local_ec = 0;
  TPZVec<int>::size(&local_40);
  local_13c = 2;
  TPZManVector<int,_10>::TPZManVector
            (in_stack_fffffffffffff960,in_stack_fffffffffffff958,(int *)in_stack_fffffffffffff950);
  TPZManVector<int,_81>::TPZManVector(in_stack_fffffffffffff950,(int64_t)in_stack_fffffffffffff948);
  iVar9 = 0;
  for (iVar8 = 0; iVar1 = iVar9, iVar8 < 3; iVar8 = iVar8 + 1) {
    iVar1 = pztopology::TPZLine::SideDimension(0x18a5f90);
    if (iVar1 == 0) {
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_fffffffffffff940);
      pztopology::TPZLine::LowerDimensionSides
                ((int)((ulong)in_stack_fffffffffffff940 >> 0x20),
                 (TPZStack<int,_10> *)in_stack_fffffffffffff938);
      iVar2 = TPZVec<int>::NElements(local_2f8);
      local_2fc = (int)iVar2 + 1;
      TPZManVector<int,_27>::TPZManVector
                ((TPZManVector<int,_27> *)in_stack_fffffffffffff950,
                 (int64_t)in_stack_fffffffffffff948);
      HDivPermutation((int)((ulong)in_stack_fffffffffffff9d0 >> 0x20),in_stack_fffffffffffff9c8,
                      in_stack_fffffffffffff9c0);
      local_394 = iVar9;
      iVar9 = local_394;
      for (local_398 = 0; local_398 < local_2fc; local_398 = local_398 + 1) {
        piVar3 = TPZVec<int>::operator[](local_390,(long)local_398);
        iVar1 = *piVar3 + local_394;
        piVar3 = TPZVec<int>::operator[](local_2a8,(long)(local_394 + local_398));
        *piVar3 = iVar1;
        iVar1 = iVar8;
        piVar3 = TPZVec<int>::operator[](local_138,(long)iVar9);
        *piVar3 = iVar8;
        iVar9 = iVar9 + 1;
        iVar8 = iVar1;
      }
      TPZManVector<int,_27>::~TPZManVector((TPZManVector<int,_27> *)in_stack_fffffffffffff930);
      TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x18a61b3);
    }
  }
  while (local_ec = iVar1, lVar4 = (long)iVar9, iVar2 = TPZVec<int>::size(local_2a8), lVar4 < iVar2)
  {
    iVar1 = iVar9;
    piVar3 = TPZVec<int>::operator[](local_2a8,(long)iVar9);
    *piVar3 = iVar9;
    iVar9 = iVar1 + 1;
    iVar1 = local_ec;
  }
  TPZGenMatrix<int>::TPZGenMatrix
            ((TPZGenMatrix<int> *)in_stack_fffffffffffff950,(int64_t)in_stack_fffffffffffff948,
             (int64_t)in_stack_fffffffffffff940);
  pzshape::TPZShapeLinear::ShapeOrder
            (in_stack_fffffffffffff940,in_stack_fffffffffffff938,
             (TPZGenMatrix<int> *)in_stack_fffffffffffff930);
  piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(local_8 + 0x2b50),2);
  local_3b4 = *piVar3 + 1;
  TPZManVector<long,_27>::TPZManVector
            ((TPZManVector<long,_27> *)in_stack_fffffffffffff950,(int64_t)in_stack_fffffffffffff948)
  ;
  FirstShapeIndex((TPZVec<long> *)in_stack_fffffffffffff950,(int *)in_stack_fffffffffffff948);
  local_4b8 = TPZVec<int>::NElements(&local_40);
  iVar9 = 0;
  local_4bc = 0;
  for (local_4c0 = 0; local_4c0 < local_ec; local_4c0 = local_4c0 + 1) {
    piVar3 = TPZVec<int>::operator[](local_2a8,(long)local_4c0);
    local_4c4 = *piVar3;
    piVar3 = TPZVec<int>::operator[](&local_40,(long)local_4c4);
    local_4c8 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_138,(long)local_4c0);
    local_4d0 = *piVar3;
    local_4cc = local_4d0;
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(local_8 + 0x2b50),(long)local_4d0);
    local_4d4 = *piVar3;
    plVar5 = TPZVec<long>::operator[](local_4b0,(long)local_4c8);
    local_4d8 = (int)*plVar5;
    plVar5 = TPZVec<long>::operator[](local_4b0,(long)(local_4c8 + 1));
    local_4dc = (int)*plVar5;
    for (local_4e0 = local_4d8; local_4e0 < local_4dc; local_4e0 = local_4e0 + 1) {
      local_4e4 = pztopology::TPZLine::SideDimension(0x18a64d7);
      local_4e8 = 1;
      for (local_4ec = 0; local_4ec < local_4e4; local_4ec = local_4ec + 1) {
        piVar3 = TPZGenMatrix<int>::operator()
                           ((TPZGenMatrix<int> *)in_stack_fffffffffffff938,
                            (int64_t)in_stack_fffffffffffff930,(int64_t)in_stack_fffffffffffff928);
        if (local_4d4 < *piVar3) {
          local_4e8 = 0;
        }
      }
      if (local_4e8 != 0) {
        local_4f4 = std::make_pair<int&,int&>(in_stack_fffffffffffff928,(int *)0x18a65d5);
        ppVar6 = TPZVec<std::pair<int,_long>_>::operator[]
                           ((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510),(long)iVar9);
        std::pair<int,long>::operator=((pair<int,long> *)ppVar6,&local_4f4);
        iVar9 = iVar9 + 1;
      }
    }
  }
  for (local_4f8 = local_ec; local_4f8 < local_4b8; local_4f8 = local_4f8 + 1) {
    piVar3 = TPZVec<int>::operator[](local_2a8,(long)local_4f8);
    local_4fc = *piVar3;
    piVar3 = TPZVec<int>::operator[](&local_40,(long)local_4fc);
    local_500 = *piVar3;
    piVar3 = TPZVec<int>::operator[](&local_70,(long)local_4fc);
    local_504 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_b0,(long)local_4fc);
    local_508 = *piVar3;
    local_50c = pztopology::TPZLine::Type(local_500);
    plVar5 = TPZVec<long>::operator[](local_4b0,(long)local_500);
    local_510 = (int)*plVar5;
    plVar5 = TPZVec<long>::operator[](local_4b0,(long)(local_500 + 1));
    local_514 = (int)*plVar5;
    for (local_518 = local_510; local_518 < local_514; local_518 = local_518 + 1) {
      local_51c = pztopology::TPZLine::SideDimension(0x18a67fb);
      local_534[3] = local_e4;
      local_524 = local_e4;
      local_520 = local_e4;
      if (local_504 != 0) {
        local_534[(long)local_508 + 3] = local_534[(long)local_508 + 3] + 1;
      }
      memset(local_534,0,0xc);
      local_538 = 1;
      for (local_53c = 0; local_53c < local_51c; local_53c = local_53c + 1) {
        if ((local_50c == ETriangle) || (local_50c == ETetraedro)) {
          piVar3 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)in_stack_fffffffffffff938,
                              (int64_t)in_stack_fffffffffffff930,(int64_t)in_stack_fffffffffffff928)
          ;
          local_534[local_53c] = *piVar3;
          local_540 = local_534[(long)local_53c + 3] + 1;
          if (local_540 < local_534[local_53c]) {
            local_538 = 0;
          }
        }
        else if (local_50c == EQuadrilateral) {
          piVar3 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)in_stack_fffffffffffff938,
                              (int64_t)in_stack_fffffffffffff930,(int64_t)in_stack_fffffffffffff928)
          ;
          local_534[local_53c] = *piVar3;
          local_544 = local_534[(long)local_53c + 3];
          if (local_544 < local_534[local_53c]) {
            local_538 = 0;
          }
        }
        else if (local_50c == ECube) {
          piVar3 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)in_stack_fffffffffffff938,
                              (int64_t)in_stack_fffffffffffff930,(int64_t)in_stack_fffffffffffff928)
          ;
          local_534[local_53c] = *piVar3;
          if (local_534[(long)local_53c + 3] < local_534[local_53c]) {
            local_538 = 0;
          }
        }
        else if (local_50c == EPrisma) {
          piVar3 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)in_stack_fffffffffffff938,
                              (int64_t)in_stack_fffffffffffff930,(int64_t)in_stack_fffffffffffff928)
          ;
          if (local_534[(long)local_53c + 3] < *piVar3) {
            local_538 = 0;
          }
        }
        else if (local_50c == EOned) {
          piVar3 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)in_stack_fffffffffffff938,
                              (int64_t)in_stack_fffffffffffff930,(int64_t)in_stack_fffffffffffff928)
          ;
          local_534[0] = *piVar3;
          if (local_534[(long)local_53c + 3] < *piVar3) {
            local_538 = 0;
          }
        }
        else if (local_50c == EPiramide) {
          piVar3 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)in_stack_fffffffffffff938,
                              (int64_t)in_stack_fffffffffffff930,(int64_t)in_stack_fffffffffffff928)
          ;
          local_534[local_53c] = *piVar3;
          if (local_534[(long)local_53c + 3] < local_534[local_53c]) {
            local_538 = 0;
          }
        }
        else {
          pzinternal::DebugStopImpl((char *)CONCAT44(iVar9,iVar8),in_stack_fffffffffffffd48);
        }
      }
      if (local_538 != 0) {
        local_54c = std::make_pair<int&,int&>(in_stack_fffffffffffff928,(int *)0x18a6b99);
        ppVar6 = TPZVec<std::pair<int,_long>_>::operator[]
                           ((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510),(long)iVar9);
        std::pair<int,long>::operator=((pair<int,long> *)ppVar6,&local_54c);
        iVar9 = iVar9 + 1;
      }
    }
  }
  iVar2 = TPZVec<std::pair<int,_long>_>::size((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510));
  if (iVar9 != (int)iVar2) {
    poVar7 = std::operator<<((ostream *)&std::cout,"count ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar9);
    in_stack_fffffffffffff930 = (TPZManVector<int,_81> *)std::operator<<(poVar7,"\nivs ");
    this = (void *)std::ostream::operator<<(in_stack_fffffffffffff930,(int)iVar2);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl((char *)CONCAT44(iVar9,iVar8),in_stack_fffffffffffffd48);
  }
  TPZManVector<long,_27>::~TPZManVector((TPZManVector<long,_27> *)in_stack_fffffffffffff930);
  TPZGenMatrix<int>::~TPZGenMatrix((TPZGenMatrix<int> *)in_stack_fffffffffffff930);
  TPZManVector<int,_81>::~TPZManVector(in_stack_fffffffffffff930);
  TPZManVector<int,_10>::~TPZManVector((TPZManVector<int,_10> *)in_stack_fffffffffffff930);
  TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)in_stack_fffffffffffff930);
  TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)in_stack_fffffffffffff930);
  TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)in_stack_fffffffffffff930);
  TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)in_stack_fffffffffffff930);
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeVecandShape(TPZShapeData &data) {
    const int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    TPZManVector<int,numvec> VectorSides(numvec),bilinear(numvec),directions(numvec);
    TPZManVector<int,numvec> normalsides(numvec);

    TSHAPE::GetSideHDivDirections(VectorSides,directions,bilinear,normalsides);

    if (data.fSDVecShapeIndex.size() == 0) {
        DebugStop();
    }
    
    // const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];//TODOPHIL
    const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];

    int nshape = TSHAPE::NShapeF(data.fH1ConnectOrders);

    int nexternalvectors = 0;
    TPZManVector<int> facevector(VectorSides.size(),TSHAPE::NSides-1);
    // compute the permutation which needs to be applied to the vectors to enforce compatibility between neighbours
    TPZManVector<int,81> vecpermute(TSHAPE::NSides*TSHAPE::Dimension);
    if (TSHAPE::Type() == EPiramide) {
        DebugStop();
    }
    int count = 0;
    for (int side = 0; side < TSHAPE::NSides; side++) {
        if (TSHAPE::SideDimension(side) != TSHAPE::Dimension -1) {
            continue;
        }
        TPZStack<int> smallsides;
        TSHAPE::LowerDimensionSides(side,smallsides);
//        TPZGeoElSide gelside(gel,side);
//        int nlowdim = gelside.NSides();
        const int nlowdim = smallsides.NElements()+1;
        TPZManVector<int,27> permgather(nlowdim);
        HDivPermutation(side,data, permgather);
        int counthold = count;
        for (int i=0; i<nlowdim; i++) {
            vecpermute[counthold+i] = permgather[i]+counthold;
            facevector[count] = side;
            count++;
        }
    }

    nexternalvectors = count;
    for (; count < vecpermute.size(); count++) {
        vecpermute[count] = count;
    }
    TPZGenMatrix<int> shapeorders(nshape,3);
    TSHAPE::ShapeOrder(data.fCornerNodeIds, data.fH1ConnectOrders, shapeorders);

//    int nshapeflux = NFluxShapeF();
//    IndexVecShape.Resize(nshapeflux);

    int scalarorder = data.fHDivConnectOrders[TSHAPE::NFacets]+1;
    // VectorSide indicates the side associated with each vector entry
    TPZManVector<int64_t,27> FirstIndex(TSHAPE::NSides+1);
    // the first index of the shape functions
    FirstShapeIndex(FirstIndex,scalarorder);

    int64_t nvec = VectorSides.NElements();
    count = 0;

    const int firstface = TSHAPE::NSides-TSHAPE::NFacets-1;
    for (int locvec = 0; locvec<nexternalvectors; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int face = facevector[locvec];
//        int connectindex = SideConnectLocId(0, face);
        int connectindex = face-firstface;
//        int order = this->Connect(connectindex).Order();
        //int order = data.fHDivConnectOrders[connectindex];
        int order = data.fHDivConnectOrders[connectindex];//TODOPHIL

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (shapeorders(ish,d) > order) {
                    include = false;
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }


    for (int locvec = nexternalvectors; locvec<nvec; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int bil = bilinear[ivec];
        int dir = directions[ivec];
        MElementType tipo = TSHAPE::Type(side);

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int maxorder[3] = {pressureorder,pressureorder,pressureorder};
            if (bil) {
                maxorder[dir]++;
            }
            int shord[3] = {0};
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (tipo==ETriangle||tipo==ETetraedro)//
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d]+1;
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==EQuadrilateral)
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d];
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==ECube)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo==EPrisma)
                {
                    //DebugStop();
                    if (shapeorders(ish,d) > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EOned)
                {
                    shord[0] = shapeorders(ish,0);
                    if (shord[0] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EPiramide)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else
                {
                    DebugStop();
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }

    int ivs =  data.fSDVecShapeIndex.size();
    if (count != ivs) {
        std::cout<<"count "<<count
                 <<"\nivs "<<ivs<<std::endl;
        DebugStop();
    }
    
}